

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
upb::generator::(anonymous_namespace)::MapValueSize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDefPtr map_field,
          string_view expr)

{
  char *pcVar1;
  string_view expr_00;
  MessageDefPtr local_40;
  FieldDefPtr local_38;
  CType local_2c;
  FieldDefPtr FStack_28;
  upb_CType ctype;
  string_view expr_local;
  FieldDefPtr map_field_local;
  
  pcVar1 = expr._M_str;
  expr_local._M_len = expr._M_len;
  FStack_28.ptr_ = map_field.ptr_;
  expr_local._M_str = (char *)this;
  local_40 = FieldDefPtr::message_type((FieldDefPtr *)&expr_local._M_str);
  local_38 = MessageDefPtr::map_value(&local_40);
  local_2c = FieldDefPtr::ctype(&local_38);
  expr_00._M_str = pcVar1;
  expr_00._M_len = expr_local._M_len;
  MapKeyValueSize_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)local_2c,
             (upb_CType)FStack_28.ptr_,expr_00);
  return __return_storage_ptr__;
}

Assistant:

std::string MapValueSize(upb::FieldDefPtr map_field, absl::string_view expr) {
  const upb_CType ctype = map_field.message_type().map_value().ctype();
  return MapKeyValueSize(ctype, expr);
}